

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_heap.c
# Opt level: O0

sexp_heap_conflict sexp_gc_packed_heap_make(size_t packed_size,size_t free_size)

{
  char *pcVar1;
  ulong size;
  ulong in_RSI;
  long in_RDI;
  size_t pad;
  sexp base;
  sexp_heap_conflict heap;
  size_t req_size;
  size_t in_stack_ffffffffffffffd8;
  sexp_heap_conflict local_8;
  
  if ((in_RSI != 0) && (in_RSI < 0x20)) {
    in_RSI = 0x20;
  }
  size = in_RSI + 0x1f & 0xffffffffffffffe0;
  local_8 = sexp_make_heap(size,in_RDI + size + 0x90,in_stack_ffffffffffffffd8);
  if (local_8 == (sexp_heap_conflict)0x0) {
    snprintf(gc_heap_err_str,0x100,"Could not allocate memory for heap");
    local_8 = (sexp_heap_conflict)0x0;
  }
  else {
    pcVar1 = local_8->data;
    local_8->size = (sexp_uint_t)(pcVar1 + in_RDI + size + (0x20 - (long)local_8->data));
    local_8->free_list->size = 0;
    if (size == 0) {
      local_8->free_list->next = (sexp_free_list)0x0;
    }
    else {
      local_8->free_list->next = (sexp_free_list)(pcVar1 + in_RDI + 0x20);
      local_8->free_list->next->next = (sexp_free_list)0x0;
      local_8->free_list->next->size = size;
    }
  }
  return local_8;
}

Assistant:

static sexp_heap sexp_gc_packed_heap_make(size_t packed_size, size_t free_size) {
  if (free_size > 0 && free_size < 2*sexp_free_chunk_size) {
    free_size = 2*sexp_free_chunk_size;
  }
  free_size = sexp_heap_align(free_size);
  size_t req_size = packed_size + free_size + sexp_free_chunk_size + 128;
  sexp_heap heap = sexp_make_heap(sexp_heap_align(req_size), 0, 0);
  if (!heap) {
    snprintf(gc_heap_err_str, ERR_STR_SIZE, "Could not allocate memory for heap");
    return NULL;
  }
  sexp base = sexp_heap_first_block(heap);
  size_t pad = (unsigned char *)base - (unsigned char *)heap->data;
  heap->size = packed_size + free_size + pad;
  heap->free_list->size = 0;
  if (free_size == 0) {
    heap->free_list->next = NULL;
  } else {
    heap->free_list->next = (sexp_free_list)((unsigned char *)base + packed_size);
    heap->free_list->next->next = NULL;
    heap->free_list->next->size = free_size;
  }
  return heap;
}